

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::AddInstruction(SQFuncState *this,SQInstruction *i)

{
  bool bVar1;
  uint uVar2;
  SQUnsignedInteger SVar3;
  SQInstruction *pSVar4;
  long local_30;
  SQInteger aat;
  SQInstruction *pi;
  SQInteger size;
  SQInstruction *i_local;
  SQFuncState *this_local;
  
  SVar3 = sqvector<SQInstruction>::size(&this->_instructions);
  if ((0 < (long)SVar3) && ((this->_optimization & 1U) != 0)) {
    pSVar4 = sqvector<SQInstruction>::operator[](&this->_instructions,SVar3 - 1);
    switch(i->op) {
    case '\0':
      if (pSVar4->op == '\0') {
        sqvector<SQInstruction>::pop_back(&this->_instructions);
        sqvector<SQLineInfo>::pop_back(&this->_lineinfos);
      }
      break;
    case '\x01':
      if ((pSVar4->op == '\x01') && (i->_arg1 < 0x100)) {
        pSVar4->op = '\x04';
        pSVar4->_arg2 = i->_arg0;
        pSVar4->_arg3 = (uchar)i->_arg1;
        return;
      }
      break;
    case '\a':
      if (((pSVar4->op == '\x01') && ((uint)pSVar4->_arg0 == i->_arg1)) &&
         (bVar1 = IsLocal(this,(ulong)pSVar4->_arg0), !bVar1)) {
        pSVar4->op = '\b';
        pSVar4->_arg0 = i->_arg0;
        pSVar4->_arg1 = pSVar4->_arg1;
        pSVar4->_arg2 = i->_arg2;
        pSVar4->_arg3 = i->_arg3;
        return;
      }
      break;
    case '\n':
      uVar2 = (uint)pSVar4->op;
      if (((((uVar2 - 1 < 3) || (uVar2 == 0xe)) || (uVar2 - 0x11 < 6)) || (uVar2 == 0x1a)) &&
         ((uint)pSVar4->_arg0 == i->_arg1)) {
        pSVar4->_arg0 = i->_arg0;
        this->_optimization = false;
        return;
      }
      if (pSVar4->op == '\n') {
        pSVar4->op = '\x1b';
        pSVar4->_arg2 = i->_arg0;
        pSVar4->_arg3 = (uchar)i->_arg1;
        return;
      }
      break;
    case '\v':
    case '\r':
      if (i->_arg0 == i->_arg3) {
        i->_arg0 = 0xff;
      }
      break;
    case '\x0e':
      if (((pSVar4->op == '\x01') && (pSVar4->_arg0 == i->_arg2)) &&
         (bVar1 = IsLocal(this,(ulong)pSVar4->_arg0), !bVar1)) {
        pSVar4->_arg1 = pSVar4->_arg1;
        pSVar4->_arg2 = (uchar)i->_arg1;
        pSVar4->op = '\t';
        pSVar4->_arg0 = i->_arg0;
        return;
      }
      break;
    case '\x0f':
    case '\x10':
      if (((pSVar4->op == '\x01') && ((uint)pSVar4->_arg0 == i->_arg1)) &&
         (bVar1 = IsLocal(this,(ulong)pSVar4->_arg0), !bVar1)) {
        pSVar4->op = i->op;
        pSVar4->_arg0 = i->_arg0;
        pSVar4->_arg1 = pSVar4->_arg1;
        pSVar4->_arg2 = i->_arg2;
        pSVar4->_arg3 = 0xff;
        return;
      }
      break;
    case '\x17':
      if ((((this->_parent == (SQFuncState *)0x0) || (i->_arg0 == 0xff)) || (pSVar4->op != '\x06'))
         || ((long)(SVar3 - 1) <= this->_returnexp)) {
        if (pSVar4->op == '<') {
          *pSVar4 = *i;
          return;
        }
      }
      else {
        pSVar4->op = '\x05';
      }
      break;
    case '\x18':
      if ((pSVar4->op == '\x18') && ((uint)pSVar4->_arg0 + pSVar4->_arg1 == (uint)i->_arg0)) {
        pSVar4->_arg1 = pSVar4->_arg1 + 1;
        pSVar4->op = '\x18';
        return;
      }
      break;
    case '\x1e':
      if ((pSVar4->op == '(') && (pSVar4->_arg1 < 0xff)) {
        pSVar4->op = '\x1d';
        pSVar4->_arg0 = (uchar)pSVar4->_arg1;
        pSVar4->_arg1 = i->_arg1;
        return;
      }
      break;
    case '\x1f':
      if (i->_arg0 == i->_arg2) {
        i->_arg0 = 0xff;
      }
      break;
    case '\"':
      local_30 = -1;
      switch(pSVar4->op) {
      case '\x01':
        local_30 = 1;
        break;
      case '\x02':
        local_30 = 2;
        break;
      case '\x03':
        local_30 = 3;
        break;
      default:
        break;
      case '\x1a':
        local_30 = 4;
      }
      if (((local_30 != -1) && ((uint)pSVar4->_arg0 == i->_arg1)) &&
         (bVar1 = IsLocal(this,(ulong)pSVar4->_arg0), !bVar1)) {
        pSVar4->op = '\"';
        pSVar4->_arg0 = i->_arg0;
        pSVar4->_arg1 = pSVar4->_arg1;
        pSVar4->_arg2 = (uchar)local_30;
        pSVar4->_arg3 = 0xff;
        return;
      }
    }
  }
  this->_optimization = true;
  sqvector<SQInstruction>::push_back(&this->_instructions,i);
  return;
}

Assistant:

void SQFuncState::AddInstruction(SQInstruction &i)
{
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){ //simple optimizer
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(i.op) {
        case _OP_JZ:
            if( pi.op == _OP_CMP && pi._arg1 < 0xFF) {
                pi.op = _OP_JCMP;
                pi._arg0 = (unsigned char)pi._arg1;
                pi._arg1 = i._arg1;
                return;
            }
            break;
        case _OP_SET:
        case _OP_NEWSLOT:
            if(i._arg0 == i._arg3) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_SETOUTER:
            if(i._arg0 == i._arg2) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_RETURN:
            if( _parent && i._arg0 != MAX_FUNC_STACKSIZE && pi.op == _OP_CALL && _returnexp < size-1) {
                pi.op = _OP_TAILCALL;
            } else if(pi.op == _OP_CLOSE){
                pi = i;
                return;
            }
        break;
        case _OP_GET:
            if( pi.op == _OP_LOAD && pi._arg0 == i._arg2 && (!IsLocal(pi._arg0))){
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)i._arg1;
                pi.op = _OP_GETK;
                pi._arg0 = i._arg0;

                return;
            }
        break;
        case _OP_PREPCALL:
            if( pi.op == _OP_LOAD  && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_PREPCALLK;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = i._arg3;
                return;
            }
            break;
        case _OP_APPENDARRAY: {
            SQInteger aat = -1;
            switch(pi.op) {
            case _OP_LOAD: aat = AAT_LITERAL; break;
            case _OP_LOADINT: aat = AAT_INT; break;
            case _OP_LOADBOOL: aat = AAT_BOOL; break;
            case _OP_LOADFLOAT: aat = AAT_FLOAT; break;
            default: break;
            }
            if(aat != -1 && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_APPENDARRAY;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)aat;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
                              }
            break;
        case _OP_MOVE:
            switch(pi.op) {
            case _OP_GET: case _OP_ADD: case _OP_SUB: case _OP_MUL: case _OP_DIV: case _OP_MOD: case _OP_BITW:
            case _OP_LOADINT: case _OP_LOADFLOAT: case _OP_LOADBOOL: case _OP_LOAD:

                if(pi._arg0 == i._arg1)
                {
                    pi._arg0 = i._arg0;
                    _optimization = false;
                    //_result_elimination = false;
                    return;
                }
            }

            if(pi.op == _OP_MOVE)
            {
                pi.op = _OP_DMOVE;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_LOAD:
            if(pi.op == _OP_LOAD && i._arg1 < 256) {
                pi.op = _OP_DLOAD;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_EQ:case _OP_NE:
            if(pi.op == _OP_LOAD && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0) ))
            {
                pi.op = i.op;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
            break;
        case _OP_LOADNULLS:
            if((pi.op == _OP_LOADNULLS && pi._arg0+pi._arg1 == i._arg0)) {

                pi._arg1 = pi._arg1 + 1;
                pi.op = _OP_LOADNULLS;
                return;
            }
            break;
        case _OP_LINE:
            if(pi.op == _OP_LINE) {
                _instructions.pop_back();
                _lineinfos.pop_back();
            }
            break;
        }
    }
    _optimization = true;
    _instructions.push_back(i);
}